

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O2

CatalogEntryLookup * __thiscall
duckdb::Catalog::LookupEntry
          (CatalogEntryLookup *__return_storage_ptr__,Catalog *this,CatalogEntryRetriever *retriever
          ,string *schema,EntryLookupInfo *lookup_info,OnEntryNotFound if_not_found)

{
  allocator local_31;
  string local_30;
  
  TryLookupEntry(__return_storage_ptr__,this,retriever,schema,lookup_info,if_not_found);
  if ((__return_storage_ptr__->error).initialized != true) {
    return __return_storage_ptr__;
  }
  ::std::__cxx11::string::string((string *)&local_30,anon_var_dwarf_3b2a81b + 9,&local_31);
  ErrorData::Throw(&__return_storage_ptr__->error,&local_30);
}

Assistant:

CatalogEntryLookup Catalog::LookupEntry(CatalogEntryRetriever &retriever, const string &schema,
                                        const EntryLookupInfo &lookup_info, OnEntryNotFound if_not_found) {
	auto res = TryLookupEntry(retriever, schema, lookup_info, if_not_found);

	if (res.error.HasError()) {
		res.error.Throw();
	}

	return res;
}